

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternalImpl<cmELFTypes32>::ByteSwap
          (cmELFInternalImpl<cmELFTypes32> *this,ELF_Ehdr *elf_header)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  uVar1._0_2_ = elf_header->e_type;
  uVar1._2_2_ = elf_header->e_machine;
  auVar4 = psllw(ZEXT416(uVar1),8);
  uVar1 = auVar4._0_4_ | CONCAT22((ushort)uVar1._2_2_ >> 8,(ushort)(undefined2)uVar1 >> 8);
  elf_header->e_type = (short)uVar1;
  elf_header->e_machine = (short)(uVar1 >> 0x10);
  cmELFByteSwap(&elf_header->e_version);
  cmELFByteSwap(&elf_header->e_entry);
  cmELFByteSwap(&elf_header->e_phoff);
  cmELFByteSwap(&elf_header->e_shoff);
  cmELFByteSwap(&elf_header->e_flags);
  uVar3._0_2_ = elf_header->e_ehsize;
  uVar3._2_2_ = elf_header->e_phentsize;
  uVar3._4_2_ = elf_header->e_phnum;
  uVar3._6_2_ = elf_header->e_shentsize;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar3;
  auVar4 = psllw(auVar4,8);
  uVar3 = auVar4._0_8_ |
          CONCAT26((ushort)uVar3._6_2_ >> 8,
                   CONCAT24((ushort)uVar3._4_2_ >> 8,
                            CONCAT22((ushort)uVar3._2_2_ >> 8,(ushort)(undefined2)uVar3 >> 8)));
  elf_header->e_ehsize = (short)uVar3;
  elf_header->e_phentsize = (short)(uVar3 >> 0x10);
  elf_header->e_phnum = (short)(uVar3 >> 0x20);
  elf_header->e_shentsize = (short)(uVar3 >> 0x30);
  uVar2._0_2_ = elf_header->e_shnum;
  uVar2._2_2_ = elf_header->e_shstrndx;
  auVar4 = psllw(ZEXT416(uVar2),8);
  uVar1 = auVar4._0_4_ | CONCAT22((ushort)uVar2._2_2_ >> 8,(ushort)(undefined2)uVar2 >> 8);
  elf_header->e_shnum = (short)uVar1;
  elf_header->e_shstrndx = (short)(uVar1 >> 0x10);
  return;
}

Assistant:

void ByteSwap(ELF_Ehdr& elf_header)
  {
    cmELFByteSwap(elf_header.e_type);
    cmELFByteSwap(elf_header.e_machine);
    cmELFByteSwap(elf_header.e_version);
    cmELFByteSwap(elf_header.e_entry);
    cmELFByteSwap(elf_header.e_phoff);
    cmELFByteSwap(elf_header.e_shoff);
    cmELFByteSwap(elf_header.e_flags);
    cmELFByteSwap(elf_header.e_ehsize);
    cmELFByteSwap(elf_header.e_phentsize);
    cmELFByteSwap(elf_header.e_phnum);
    cmELFByteSwap(elf_header.e_shentsize);
    cmELFByteSwap(elf_header.e_shnum);
    cmELFByteSwap(elf_header.e_shstrndx);
  }